

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariablePowerGeneralizationImpl.hpp
# Opt level: O0

Monom<Kernel::NumTraits<Kernel::RealConstantType>_> * __thiscall
Inferences::VariablePowerGeneralizationImpl::Generalize::operator()
          (Generalize *this,Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *p,
          PolyNf *evaluatedArgs)

{
  long in_RDX;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_RSI;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_RDI;
  uint i;
  RealConstantType *in_stack_fffffffffffffea8;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffeb0;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> *this_00;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *in_stack_fffffffffffffec0;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *this_01;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> *t;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariablePowerGeneralizationImpl_hpp:80:17),_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  *in_stack_ffffffffffffff28;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *in_stack_ffffffffffffff60;
  anon_class_24_3_379bf094_for__func in_stack_ffffffffffffff70;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_20;
  
  this_01 = in_RDI;
  Kernel::RealConstantType::RealConstantType
            ((RealConstantType *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Lib::
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  ::operator->((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                *)(in_RDX + 0x20));
  Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::iter
            (in_stack_fffffffffffffeb0);
  this_00 = &local_20;
  t = in_RSI;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>const&>>
  ::operator()(in_stack_ffffffffffffff60,in_stack_ffffffffffffff70);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariablePowerGeneralizationImpl.hpp:80:17),_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::collect<Lib::Stack>(in_stack_ffffffffffffff28);
  Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactors
            ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)this_00,in_RSI);
  Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
            ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)t);
  Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
            (this_01,&in_RDI->numeral,in_stack_fffffffffffffec0);
  Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::~MonomFactors
            ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x7654bd);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(this_00);
  Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x7654d7);
  return this_01;
}

Assistant:

Monom<RealTraits> operator()(Monom<RealTraits> p, PolyNf* evaluatedArgs)  
  {
    unsigned i = 0;
    return Monom<RealTraits>(
        p.numeral, 
        perfect(MonomFactors<RealTraits>(
          p.factors->iter()
           .map([&](MonomFactor<RealTraits> m) 
             { 
                auto var = m.term.tryVar();
                if (var.isSome() && !powers.get(var.unwrap()).isBot()) {
                  ASS_EQ(evaluatedArgs[i], var.unwrap());
                  return MonomFactor<RealTraits>(evaluatedArgs[i++], 2 - ( m.power % 2 ));
                } else {
                  return MonomFactor<RealTraits>(evaluatedArgs[i++], m.power); 
                }
              })
           .template collect<Stack>())));
  }